

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O0

bool __thiscall
dlib::
array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
::move_next(array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
            *this)

{
  array<dlib::list_box_helper::list_box<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
  *this_local;
  bool local_1;
  
  if ((this->_at_start & 1U) == 0) {
    if (this->pos < this->last_pos) {
      this->pos = this->pos + 1;
      local_1 = true;
    }
    else {
      this->pos = (data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                   *)0x0;
      local_1 = false;
    }
  }
  else {
    this->_at_start = false;
    if (this->array_size == 0) {
      local_1 = false;
    }
    else {
      this->pos = this->array_elements;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool array<T,mem_manager>::
    move_next (
    ) const
    {
        if (!_at_start)
        {
            if (pos < last_pos)
            {
                ++pos;
                return true;
            }
            else
            {
                pos = 0;
                return false;
            }
        }
        else
        {
            _at_start = false;
            if (array_size > 0)
            {
                pos = array_elements;
                return true;
            }
            else
            {
                return false;
            }
        }
    }